

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O2

Type miniscript::internal::ComputeType
               (Fragment fragment,Type x,Type y,Type z,
               vector<miniscript::Type,_std::allocator<miniscript::Type>_> *sub_types,uint32_t k,
               size_t data_size,size_t n_subs,size_t n_keys,MiniscriptContext ms_ctx)

{
  long lVar1;
  pointer pTVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  short sVar8;
  uint uVar9;
  short sVar10;
  size_t i;
  long lVar11;
  Fragment FVar12;
  uint uVar13;
  uint uVar14;
  char *__assertion;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  uint uVar21;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FVar12 = fragment & ~JUST_1;
  uVar17 = (ulong)k;
  if (FVar12 == RIPEMD160) {
    if (data_size != 0x14) {
      __assertion = "data_size == 20";
      uVar9 = 0x2a;
      goto LAB_00330e52;
    }
LAB_00330401:
    if (k != 0) {
      __assertion = "k == 0";
      uVar9 = 0x36;
      goto LAB_00330e52;
    }
    if (5 < fragment - AND_V) {
LAB_003304a0:
      if (6 < fragment - WRAP_A) {
        if (fragment == ANDOR) {
          if (n_subs != 3) {
            __assertion = "n_subs == 3";
            uVar9 = 0x3d;
            goto LAB_00330e52;
          }
          goto LAB_00330584;
        }
        if (n_subs != 0 && fragment != THRESH) {
          __assertion = "n_subs == 0";
          uVar9 = 0x43;
          goto LAB_00330e52;
        }
        goto LAB_00330422;
      }
      if (n_subs != 1) {
        __assertion = "n_subs == 1";
        uVar9 = 0x41;
        goto LAB_00330e52;
      }
LAB_003304b8:
      if (fragment == MULTI_A) {
        if (0x3e6 < n_keys - 1) {
          __assertion = "n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTI_A";
          uVar9 = 0x4c;
          goto LAB_00330e52;
        }
        bVar4 = IsTapscript(ms_ctx);
        uVar9 = 0x41b81;
        if (!bVar4) {
          __assertion = "IsTapscript(ms_ctx)";
          uVar9 = 0x4d;
          goto LAB_00330e52;
        }
        goto switchD_003305ab_caseD_2;
      }
      if (fragment == MULTI) {
        if (n_keys - 1 < 0x14) {
          bVar4 = IsTapscript(ms_ctx);
          uVar9 = 0x41bc1;
          if (!bVar4) goto switchD_003305ab_caseD_2;
          __assertion = "!IsTapscript(ms_ctx)";
          uVar9 = 0x4a;
        }
        else {
          __assertion = "n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTISIG";
          uVar9 = 0x49;
        }
        goto LAB_00330e52;
      }
      goto LAB_00330584;
    }
    if (n_subs != 2) {
      __assertion = "n_subs == 2";
      uVar9 = 0x3b;
      goto LAB_00330e52;
    }
LAB_00330422:
    if (FVar12 != PK_K) goto LAB_003304b8;
    if (n_keys != 1) {
      __assertion = "n_keys == 1";
      uVar9 = 0x47;
      goto LAB_00330e52;
    }
  }
  else {
    if (FVar12 == SHA256) {
      if (data_size != 0x20) {
        __assertion = "data_size == 32";
        uVar9 = 0x28;
        goto LAB_00330e52;
      }
      goto LAB_00330401;
    }
    if (data_size != 0) {
      __assertion = "data_size == 0";
      uVar9 = 0x2c;
      goto LAB_00330e52;
    }
    if (FVar12 == OLDER) {
      if ((int)k < 1) {
        __assertion = "k >= 1 && k < 0x80000000UL";
        uVar9 = 0x30;
        goto LAB_00330e52;
      }
      goto LAB_003304a0;
    }
    if (fragment - MULTI < 2) {
      if ((k == 0) || (n_keys < uVar17)) {
        __assertion = "k >= 1 && k <= n_keys";
        uVar9 = 0x32;
        goto LAB_00330e52;
      }
      goto LAB_003304a0;
    }
    if (fragment != THRESH) goto LAB_00330401;
    if ((k == 0) || (n_subs < uVar17)) {
      __assertion = "k >= 1 && k <= n_subs";
      uVar9 = 0x34;
      goto LAB_00330e52;
    }
LAB_00330584:
    if (n_keys != 0) {
      __assertion = "n_keys == 0";
      uVar9 = 0x4f;
LAB_00330e52:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,uVar9,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  if (THRESH < fragment) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x103,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  uVar9 = 0x43be4;
  sVar10 = (short)x.m_flags;
  sVar8 = (short)y.m_flags;
  uVar13 = x.m_flags >> 0x10;
  switch(fragment) {
  case JUST_0:
    uVar9 = 0x43b91;
    break;
  case JUST_1:
    uVar9 = 0x43511;
    break;
  case PK_K:
    break;
  case PK_H:
    uVar9 = 0x43bc4;
    break;
  case OLDER:
    uVar9 = ((k & 0x400000) >> 7 | (k & 0x400000) >> 8) ^ 0x4b411;
    break;
  case AFTER:
    uVar9 = (uint)(k >= 500000000) * 0x10000 + (uint)(k < 500000000) * 0x20000 + 0x43411;
    break;
  default:
    uVar9 = 0x411e1;
    break;
  case WRAP_A:
    uVar9 = (x.m_flags & 0x7df80) + (x.m_flags & 1) * 8 + 0x2000;
    break;
  case WRAP_S:
    uVar9 = (x.m_flags & 0x7ff80) + (uint)((~x.m_flags & 0x21) == 0) * 8;
    break;
  case WRAP_C:
    uVar9 = (x.m_flags >> 2 & 1) + (x.m_flags & 0x7d6e0) + 0x900;
    break;
  case WRAP_D:
    bVar4 = IsTapscript(ms_ctx);
    uVar9 = (uint)bVar4 * 0x100 +
            ((x.m_flags & 0x7d800) + (x.m_flags & 0x10) * 2 | x.m_flags >> 1 & 0x200 |
            (uint)((~x.m_flags & 0x12) == 0)) + 0x20c0;
    break;
  case WRAP_V:
    uVar9 = (x.m_flags & 0x7d870) + (x.m_flags & 1) * 2 + 0x2400;
    break;
  case WRAP_J:
    uVar9 = (uint)((~x.m_flags & 0x41) == 0) + (x.m_flags & 0x7d920 | x.m_flags >> 1 & 0x200) +
            0x20c0;
    break;
  case WRAP_N:
    uVar9 = x.m_flags & 0x7def1 | 0x2100;
    break;
  case AND_V:
    uVar14 = y.m_flags | x.m_flags;
    uVar9 = 0;
    if (((((y.m_flags & x.m_flags) >> 0x12 & 1) != 0) &&
        (((byte)(x.m_flags >> 0xe) & sVar8 < 0) == 0)) &&
       ((uVar9 = 0, (sVar10 < 0 & (byte)(y.m_flags >> 0xe) & 1) == 0 &&
        ((y.m_flags >> 0x11 & uVar13 & 1) == 0)))) {
      uVar9 = (uint)((y.m_flags >> 0x10 & 1) == 0 || (x.m_flags >> 0x11 & 1) == 0) << 0x12;
    }
    uVar9 = y.m_flags & x.m_flags & 0x1090 | uVar14 & 0x3c800 | uVar14 * 2 & uVar14 & 0x20 |
            y.m_flags & 0x2100 | x.m_flags & 0x40 | x.m_flags * 4 & y.m_flags & 0x40 |
            (int)(x.m_flags << 0x1e) >> 0x1f & y.m_flags & 7 |
            (uint)((x.m_flags & 0x800) != 0 || (y.m_flags & 0x400) != 0) << 10 | uVar9;
    break;
  case AND_B:
    uVar14 = y.m_flags | x.m_flags;
    uVar16 = y.m_flags & x.m_flags;
    uVar9 = 0;
    if ((((uVar16 >> 0x12 & 1) != 0) && (((byte)(x.m_flags >> 0xe) & sVar8 < 0) == 0)) &&
       (((sVar10 < 0 & (byte)(y.m_flags >> 0xe) & 1) == 0 && ((y.m_flags >> 0x11 & uVar13 & 1) == 0)
        ))) {
      uVar9 = (uint)((y.m_flags >> 0x10 & 1) == 0 || (x.m_flags >> 0x11 & 1) == 0) << 0x12;
    }
    uVar9 = uVar14 * 2 & uVar14 & 0x20 | uVar16 >> 2 & uVar16 & 0x200 |
            uVar16 & 0x1090 | uVar14 & 0x3c800 | y.m_flags >> 3 & x.m_flags & 1 |
            x.m_flags & 0x40 | x.m_flags * 4 & y.m_flags & 0x40 | uVar9 |
            (uint)(((~y.m_flags & 0xc00) == 0 || (~x.m_flags & 0xc00) == 0) |
                  (byte)(uVar16 >> 10) & 1) << 10 | 0x2100;
    break;
  case OR_B:
    uVar9 = y.m_flags | x.m_flags;
    uVar13 = y.m_flags & x.m_flags;
    uVar9 = (uVar13 * 8 & uVar13 & uVar9 * 2 & 0x1000) +
            (uVar13 & 0x40a10 | uVar9 & 0x3c000 |
             (uint)((~y.m_flags & 0x88) == 0 && (~x.m_flags & 0x81) == 0) | uVar9 & uVar9 * 2 & 0x20
            ) + 0x2180;
    break;
  case OR_C:
    uVar9 = y.m_flags & x.m_flags;
    if ((x.m_flags >> 9 & 1) == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (y.m_flags | x.m_flags) * 2 & uVar9 & 0x1000;
    }
    uVar14 = 0x2400;
    if ((x.m_flags & 0x181) == 0x181) {
      uVar14 = y.m_flags & 2 | 0x2400;
    }
    uVar9 = y.m_flags * 2 & x.m_flags & 0x20 | uVar13 |
            uVar14 | uVar9 & 0x810 | (y.m_flags | x.m_flags) & 0x3c000 | uVar9 & 0x40000;
    break;
  case OR_D:
    uVar9 = y.m_flags & x.m_flags;
    if ((x.m_flags >> 9 & 1) == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (x.m_flags | y.m_flags) * 2 & uVar9 & 0x1000;
    }
    uVar9 = uVar9 & 0x40000 |
            (x.m_flags | y.m_flags) & 0x3c000 |
            y.m_flags & ((~x.m_flags & 0x181) == 0 | 0x780) | uVar9 & 0x810 |
            y.m_flags * 2 & x.m_flags & 0x20 | uVar13;
    goto LAB_00330d22;
  case OR_I:
    uVar9 = y.m_flags & x.m_flags;
    uVar13 = y.m_flags | x.m_flags;
    uVar9 = ((uVar9 & 0x40d07 | uVar13 & 0x3c080) + (uVar9 & 0x10) * 2 |
            uVar13 >> 1 & uVar13 & 0x200) + (uVar13 * 2 & uVar9 & 0x1000) + 0x2000;
    break;
  case ANDOR:
    uVar16 = y.m_flags & z.m_flags;
    uVar14 = 0;
    uVar9 = uVar16 & 7;
    if ((~x.m_flags & 0x181) != 0) {
      uVar9 = uVar14;
    }
    uVar19 = uVar16 & x.m_flags;
    uVar18 = z.m_flags & 0x200;
    uVar3 = z.m_flags & 0x400;
    if ((y.m_flags & 0x400) == 0 && (x.m_flags & 0x800) == 0) {
      uVar18 = uVar14;
      uVar3 = uVar14;
    }
    uVar21 = y.m_flags | x.m_flags | z.m_flags;
    if ((x.m_flags >> 9 & 1) != 0) {
      uVar14 = uVar21 * 2 & uVar19 & 0x1000;
    }
    uVar6 = 0;
    if (((((uVar19 >> 0x12 & 1) != 0) && (((byte)(x.m_flags >> 0xe) & sVar8 < 0) == 0)) &&
        ((sVar10 < 0 & (byte)(y.m_flags >> 0xe) & 1) == 0)) &&
       ((y.m_flags >> 0x11 & uVar13 & 1) == 0)) {
      uVar6 = (uint)((y.m_flags >> 0x10 & 1) == 0 || (x.m_flags >> 0x11 & 1) == 0) << 0x12;
    }
    uVar9 = (uVar16 | x.m_flags) * 2 & (uVar16 | x.m_flags) & 0x20 | uVar14 | uVar6 |
            uVar3 | uVar18 |
            uVar9 | uVar21 & 0x3c000 |
            z.m_flags & 0x80 | uVar16 & 0x100 | (y.m_flags | x.m_flags) & z.m_flags & 0x800 |
            uVar19 & 0x10;
LAB_00330d22:
    uVar9 = uVar9 | 0x2000;
    break;
  case THRESH:
    pTVar2 = (sub_types->super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>).
             _M_impl.super__Vector_impl_data._M_start;
    bVar20 = 1;
    uVar13 = 0x40000;
    uVar9 = 0;
    iVar15 = 0;
    bVar5 = 1;
    for (lVar11 = 0;
        (long)(sub_types->super__Vector_base<miniscript::Type,_std::allocator<miniscript::Type>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 2 != lVar11;
        lVar11 = lVar11 + 1) {
      uVar14 = pTVar2[lVar11].m_flags;
      uVar16 = 0xfffffe77;
      if (lVar11 == 0) {
        uVar16 = 0xfffffe7e;
      }
      if ((uVar16 | uVar14) != 0xffffffff) {
        uVar9 = 0;
        goto switchD_003305ab_caseD_2;
      }
      uVar18 = 0;
      uVar9 = uVar9 + ((uVar14 >> 0xb & 1) != 0);
      uVar16 = ((uVar14 & 0x20) == 0) + 1;
      if ((uVar14 & 0x10) != 0) {
        uVar16 = uVar18;
      }
      if (((uVar13 & uVar14) >> 0x12 != 0) &&
         ((k < 2 || ((((((uVar13 >> 0xe & 1) == 0 || ((uVar14 & 0x8000) == 0)) &&
                       ((-1 < (short)uVar13 || ((uVar14 & 0x4000) == 0)))) &&
                      ((uVar18 = 0, (uVar13 >> 0x10 & 1) == 0 || ((uVar14 & 0x20000) == 0)))) &&
                     (((uVar13 >> 0x11 & 1) == 0 || ((uVar14 & 0x10000) == 0)))))))) {
        uVar18 = 0x40000;
      }
      bVar5 = (byte)(uVar14 >> 9) & 1 & bVar5;
      bVar20 = (byte)(uVar14 >> 0xc) & 1 & bVar20;
      iVar15 = iVar15 + uVar16;
      uVar13 = (uVar13 | uVar14) & 0x3c000 | uVar18;
    }
    uVar14 = 1;
    if (iVar15 == 1) {
      uVar14 = 0x20;
    }
    uVar7 = (ulong)uVar9;
    uVar9 = (uint)((n_subs - uVar17) + 1 <= uVar7) << 0xb | uVar14 | (uint)(iVar15 == 0) << 4 |
            (uint)(uVar7 == n_subs & bVar5) << 9 |
            (uint)(n_subs - uVar17 <= uVar7 & bVar20 & bVar5) << 0xc | uVar13 | 0x181;
  }
switchD_003305ab_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Type)uVar9;
}

Assistant:

Type ComputeType(Fragment fragment, Type x, Type y, Type z, const std::vector<Type>& sub_types, uint32_t k,
                 size_t data_size, size_t n_subs, size_t n_keys, MiniscriptContext ms_ctx) {
    // Sanity check on data
    if (fragment == Fragment::SHA256 || fragment == Fragment::HASH256) {
        assert(data_size == 32);
    } else if (fragment == Fragment::RIPEMD160 || fragment == Fragment::HASH160) {
        assert(data_size == 20);
    } else {
        assert(data_size == 0);
    }
    // Sanity check on k
    if (fragment == Fragment::OLDER || fragment == Fragment::AFTER) {
        assert(k >= 1 && k < 0x80000000UL);
    } else if (fragment == Fragment::MULTI || fragment == Fragment::MULTI_A) {
        assert(k >= 1 && k <= n_keys);
    } else if (fragment == Fragment::THRESH) {
        assert(k >= 1 && k <= n_subs);
    } else {
        assert(k == 0);
    }
    // Sanity check on subs
    if (fragment == Fragment::AND_V || fragment == Fragment::AND_B || fragment == Fragment::OR_B ||
        fragment == Fragment::OR_C || fragment == Fragment::OR_I || fragment == Fragment::OR_D) {
        assert(n_subs == 2);
    } else if (fragment == Fragment::ANDOR) {
        assert(n_subs == 3);
    } else if (fragment == Fragment::WRAP_A || fragment == Fragment::WRAP_S || fragment == Fragment::WRAP_C ||
               fragment == Fragment::WRAP_D || fragment == Fragment::WRAP_V || fragment == Fragment::WRAP_J ||
               fragment == Fragment::WRAP_N) {
        assert(n_subs == 1);
    } else if (fragment != Fragment::THRESH) {
        assert(n_subs == 0);
    }
    // Sanity check on keys
    if (fragment == Fragment::PK_K || fragment == Fragment::PK_H) {
        assert(n_keys == 1);
    } else if (fragment == Fragment::MULTI) {
        assert(n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTISIG);
        assert(!IsTapscript(ms_ctx));
    } else if (fragment == Fragment::MULTI_A) {
        assert(n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTI_A);
        assert(IsTapscript(ms_ctx));
    } else {
        assert(n_keys == 0);
    }

    // Below is the per-fragment logic for computing the expression types.
    // It heavily relies on Type's << operator (where "X << a_mst" means
    // "X has all properties listed in a").
    switch (fragment) {
        case Fragment::PK_K: return "Konudemsxk"_mst;
        case Fragment::PK_H: return "Knudemsxk"_mst;
        case Fragment::OLDER: return
            "g"_mst.If(k & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG) |
            "h"_mst.If(!(k & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG)) |
            "Bzfmxk"_mst;
        case Fragment::AFTER: return
            "i"_mst.If(k >= LOCKTIME_THRESHOLD) |
            "j"_mst.If(k < LOCKTIME_THRESHOLD) |
            "Bzfmxk"_mst;
        case Fragment::SHA256: return "Bonudmk"_mst;
        case Fragment::RIPEMD160: return "Bonudmk"_mst;
        case Fragment::HASH256: return "Bonudmk"_mst;
        case Fragment::HASH160: return "Bonudmk"_mst;
        case Fragment::JUST_1: return "Bzufmxk"_mst;
        case Fragment::JUST_0: return "Bzudemsxk"_mst;
        case Fragment::WRAP_A: return
            "W"_mst.If(x << "B"_mst) | // W=B_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "udfems"_mst) | // u=u_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x
            "x"_mst; // x
        case Fragment::WRAP_S: return
            "W"_mst.If(x << "Bo"_mst) | // W=B_x*o_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "udfemsx"_mst); // u=u_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x, x=x_x
        case Fragment::WRAP_C: return
            "B"_mst.If(x << "K"_mst) | // B=K_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "ondfem"_mst) | // o=o_x, n=n_x, d=d_x, f=f_x, e=e_x, m=m_x
            "us"_mst; // u, s
        case Fragment::WRAP_D: return
            "B"_mst.If(x << "Vz"_mst) | // B=V_x*z_x
            "o"_mst.If(x << "z"_mst) | // o=z_x
            "e"_mst.If(x << "f"_mst) | // e=f_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "ms"_mst) | // m=m_x, s=s_x
            // NOTE: 'd:' is 'u' under Tapscript but not P2WSH as MINIMALIF is only a policy rule there.
            "u"_mst.If(IsTapscript(ms_ctx)) |
            "ndx"_mst; // n, d, x
        case Fragment::WRAP_V: return
            "V"_mst.If(x << "B"_mst) | // V=B_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "zonms"_mst) | // z=z_x, o=o_x, n=n_x, m=m_x, s=s_x
            "fx"_mst; // f, x
        case Fragment::WRAP_J: return
            "B"_mst.If(x << "Bn"_mst) | // B=B_x*n_x
            "e"_mst.If(x << "f"_mst) | // e=f_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "oums"_mst) | // o=o_x, u=u_x, m=m_x, s=s_x
            "ndx"_mst; // n, d, x
        case Fragment::WRAP_N: return
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "Bzondfems"_mst) | // B=B_x, z=z_x, o=o_x, n=n_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x
            "ux"_mst; // u, x
        case Fragment::AND_V: return
            (y & "KVB"_mst).If(x << "V"_mst) | // B=V_x*B_y, V=V_x*V_y, K=V_x*K_y
            (x & "n"_mst) | (y & "n"_mst).If(x << "z"_mst) | // n=n_x+z_x*n_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & y & "dmz"_mst) | // d=d_x*d_y, m=m_x*m_y, z=z_x*z_y
            ((x | y) & "s"_mst) | // s=s_x+s_y
            "f"_mst.If((y << "f"_mst) || (x << "s"_mst)) | // f=f_y+s_x
            (y & "ux"_mst) | // u=u_y, x=x_y
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            "k"_mst.If(((x & y) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*!(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::AND_B: return
            (x & "B"_mst).If(y << "W"_mst) | // B=B_x*W_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & "n"_mst) | (y & "n"_mst).If(x << "z"_mst) | // n=n_x+z_x*n_y
            (x & y & "e"_mst).If((x & y) << "s"_mst) | // e=e_x*e_y*s_x*s_y
            (x & y & "dzm"_mst) | // d=d_x*d_y, z=z_x*z_y, m=m_x*m_y
            "f"_mst.If(((x & y) << "f"_mst) || (x << "sf"_mst) || (y << "sf"_mst)) | // f=f_x*f_y + f_x*s_x + f_y*s_y
            ((x | y) & "s"_mst) | // s=s_x+s_y
            "ux"_mst | // u, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            "k"_mst.If(((x & y) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*!(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::OR_B: return
            "B"_mst.If(x << "Bd"_mst && y << "Wd"_mst) | // B=B_x*d_x*W_x*d_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & y & "m"_mst).If((x | y) << "s"_mst && (x & y) << "e"_mst) | // m=m_x*m_y*e_x*e_y*(s_x+s_y)
            (x & y & "zse"_mst) | // z=z_x*z_y, s=s_x*s_y, e=e_x*e_y
            "dux"_mst | // d, u, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_D: return
            (y & "B"_mst).If(x << "Bdu"_mst) | // B=B_y*B_x*d_x*u_x
            (x & "o"_mst).If(y << "z"_mst) | // o=o_x*z_y
            (x & y & "m"_mst).If(x << "e"_mst && (x | y) << "s"_mst) | // m=m_x*m_y*e_x*(s_x+s_y)
            (x & y & "zs"_mst) | // z=z_x*z_y, s=s_x*s_y
            (y & "ufde"_mst) | // u=u_y, f=f_y, d=d_y, e=e_y
            "x"_mst | // x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_C: return
            (y & "V"_mst).If(x << "Bdu"_mst) | // V=V_y*B_x*u_x*d_x
            (x & "o"_mst).If(y << "z"_mst) | // o=o_x*z_y
            (x & y & "m"_mst).If(x << "e"_mst && (x | y) << "s"_mst) | // m=m_x*m_y*e_x*(s_x+s_y)
            (x & y & "zs"_mst) | // z=z_x*z_y, s=s_x*s_y
            "fx"_mst | // f, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_I: return
            (x & y & "VBKufs"_mst) | // V=V_x*V_y, B=B_x*B_y, K=K_x*K_y, u=u_x*u_y, f=f_x*f_y, s=s_x*s_y
            "o"_mst.If((x & y) << "z"_mst) | // o=z_x*z_y
            ((x | y) & "e"_mst).If((x | y) << "f"_mst) | // e=e_x*f_y+f_x*e_y
            (x & y & "m"_mst).If((x | y) << "s"_mst) | // m=m_x*m_y*(s_x+s_y)
            ((x | y) & "d"_mst) | // d=d_x+d_y
            "x"_mst | // x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::ANDOR: return
            (y & z & "BKV"_mst).If(x << "Bdu"_mst) | // B=B_x*d_x*u_x*B_y*B_z, K=B_x*d_x*u_x*K_y*K_z, V=B_x*d_x*u_x*V_y*V_z
            (x & y & z & "z"_mst) | // z=z_x*z_y*z_z
            ((x | (y & z)) & "o"_mst).If((x | (y & z)) << "z"_mst) | // o=o_x*z_y*z_z+z_x*o_y*o_z
            (y & z & "u"_mst) | // u=u_y*u_z
            (z & "f"_mst).If((x << "s"_mst) || (y << "f"_mst)) | // f=(s_x+f_y)*f_z
            (z & "d"_mst) | // d=d_z
            (z & "e"_mst).If(x << "s"_mst || y << "f"_mst) | // e=e_z*(s_x+f_y)
            (x & y & z & "m"_mst).If(x << "e"_mst && (x | y | z) << "s"_mst) | // m=m_x*m_y*m_z*e_x*(s_x+s_y+s_z)
            (z & (x | y) & "s"_mst) | // s=s_z*(s_x+s_y)
            "x"_mst | // x
            ((x | y | z) & "ghij"_mst) | // g=g_x+g_y+g_z, h=h_x+h_y+h_z, i=i_x+i_y+i_z, j=j_x+j_y_j_z
            "k"_mst.If(((x & y & z) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*k_z* !(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::MULTI: {
            return "Bnudemsk"_mst;
        }
        case Fragment::MULTI_A: {
            return "Budemsk"_mst;
        }
        case Fragment::THRESH: {
            bool all_e = true;
            bool all_m = true;
            uint32_t args = 0;
            uint32_t num_s = 0;
            Type acc_tl = "k"_mst;
            for (size_t i = 0; i < sub_types.size(); ++i) {
                Type t = sub_types[i];
                static constexpr auto WDU{"Wdu"_mst}, BDU{"Bdu"_mst};
                if (!(t << (i ? WDU : BDU))) return ""_mst; // Require Bdu, Wdu, Wdu, ...
                if (!(t << "e"_mst)) all_e = false;
                if (!(t << "m"_mst)) all_m = false;
                if (t << "s"_mst) num_s += 1;
                args += (t << "z"_mst) ? 0 : (t << "o"_mst) ? 1 : 2;
                acc_tl = ((acc_tl | t) & "ghij"_mst) |
                    // Thresh contains a combination of timelocks if it has threshold > 1 and
                    // it contains two different children that have different types of timelocks
                    // Note how if any of the children don't have "k", the parent also does not have "k"
                    "k"_mst.If(((acc_tl & t) << "k"_mst) && ((k <= 1) ||
                        ((k > 1) && !(((acc_tl << "g"_mst) && (t << "h"_mst)) ||
                        ((acc_tl << "h"_mst) && (t << "g"_mst)) ||
                        ((acc_tl << "i"_mst) && (t << "j"_mst)) ||
                        ((acc_tl << "j"_mst) && (t << "i"_mst))))));
            }
            return "Bdu"_mst |
                   "z"_mst.If(args == 0) | // z=all z
                   "o"_mst.If(args == 1) | // o=all z except one o
                   "e"_mst.If(all_e && num_s == n_subs) | // e=all e and all s
                   "m"_mst.If(all_e && all_m && num_s >= n_subs - k) | // m=all e, >=(n-k) s
                   "s"_mst.If(num_s >= n_subs - k + 1) |  // s= >=(n-k+1) s
                   acc_tl; // timelock info
            }
    }
    assert(false);
}